

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t convert<int>(char *buf,int value)

{
  uint uVar1;
  char *__last;
  int iVar2;
  char *pcVar3;
  uint in_ESI;
  char *in_RDI;
  int lsd;
  char *p;
  int i;
  char *pcVar4;
  
  pcVar3 = in_RDI;
  uVar1 = in_ESI;
  do {
    pcVar4 = pcVar3;
    iVar2 = (int)uVar1 % 10;
    uVar1 = (int)uVar1 / 10;
    pcVar3 = pcVar4 + 1;
    *pcVar4 = zero[iVar2];
  } while (uVar1 != 0);
  __last = pcVar3;
  if ((int)in_ESI < 0) {
    __last = pcVar4 + 2;
    *pcVar3 = '-';
  }
  *__last = '\0';
  std::reverse<char*>((char *)((ulong)in_ESI << 0x20),__last);
  return (long)__last - (long)in_RDI;
}

Assistant:

size_t convert(char buf[], T value){
    T i = value;
    char* p=buf;

    do{
        int lsd=static_cast<int>(i%10);
        i /=10;
        *p++ = zero[lsd];
    }while(i!=0);

    if(value<0){
        *p++ = '-';
    }
    *p = '\0';
    std::reverse(buf, p);

    return p-buf;
}